

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

bool __thiscall Rml::DataViewText::Update(DataViewText *this,DataModel *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  code *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  Element *element;
  ElementText *this_00;
  SystemInterface *pSVar6;
  bool bVar7;
  string *psVar8;
  pointer pDVar9;
  String value;
  Variant variant;
  DataExpressionInterface expression_interface;
  String local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  DataViewText *local_80;
  pointer local_78;
  undefined1 local_70 [40];
  DataExpressionInterface local_48;
  
  element = DataView::GetElement(&this->super_DataView);
  bVar7 = false;
  DataExpressionInterface::DataExpressionInterface(&local_48,model,element,(Event *)0x0);
  pDVar9 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->data_entries).
             super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar9 != local_78) {
    paVar1 = &local_a0.field_2;
    bVar7 = false;
    psVar8 = (string *)&pDVar9->value;
    local_80 = this;
    do {
      if ((*(long *)(psVar8 + -8) == 0) &&
         (bVar4 = Assert("RMLUI_ASSERT(entry.data_expression)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                         ,0x17a), !bVar4)) goto LAB_00205740;
      Variant::Variant((Variant *)local_70);
      bVar4 = DataExpression::Run(*(DataExpression **)(psVar8 + -8),&local_48,(Variant *)local_70);
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((Variant *)local_70,&local_a0);
      sVar3 = local_a0._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == paVar1) {
        local_c0.field_2._8_8_ = local_a0.field_2._8_8_;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0._M_dataplus._M_p = local_a0._M_dataplus._M_p;
      }
      local_c0.field_2._M_allocated_capacity._1_7_ = local_a0.field_2._M_allocated_capacity._1_7_;
      local_c0.field_2._M_local_buf[0] = local_a0.field_2._M_local_buf[0];
      local_c0._M_string_length = local_a0._M_string_length;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      if ((bVar4) &&
         ((__n = *(size_t *)(psVar8 + 8), __n != sVar3 ||
          ((__n != 0 && (iVar5 = bcmp(*(void **)psVar8,local_c0._M_dataplus._M_p,__n), iVar5 != 0)))
          ))) {
        bVar7 = true;
        ::std::__cxx11::string::_M_assign(psVar8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      Variant::~Variant((Variant *)local_70);
      pDVar9 = (pointer)(psVar8 + 0x20);
      this = local_80;
      psVar8 = psVar8 + 0x30;
    } while (pDVar9 != local_78);
  }
  if (bVar7) {
    this_00 = (ElementText *)DataView::GetElement(&this->super_DataView);
    if (this_00 == (ElementText *)0x0) {
      Log::Message(LT_WARNING,
                   "Could not update data view text, element no longer valid. Was it destroyed?");
    }
    else {
      BuildText_abi_cxx11_((String *)local_70,this);
      local_c0._M_string_length = 0;
      local_c0.field_2._M_allocated_capacity =
           local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pSVar6 = GetSystemInterface();
      if (pSVar6 != (SystemInterface *)0x0) {
        (*pSVar6->_vptr_SystemInterface[3])(pSVar6,&local_c0,local_70);
      }
      if (((this_00->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable !=
           (_func_int **)&PTR__ElementText_00335bc8) &&
         (bVar4 = Assert("RMLUI_ASSERT(dynamic_cast<Derived>(base_instance))",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Traits.h"
                         ,0xad), !bVar4)) {
LAB_00205740:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ElementText::SetText(this_00,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
    }
  }
  return bVar7;
}

Assistant:

bool DataViewText::Update(DataModel& model)
{
	bool entries_modified = false;
	{
		Element* element = GetElement();
		DataExpressionInterface expression_interface(&model, element);

		for (DataEntry& entry : data_entries)
		{
			RMLUI_ASSERT(entry.data_expression);
			Variant variant;
			bool result = entry.data_expression->Run(expression_interface, variant);
			const String value = variant.Get<String>();
			if (result && entry.value != value)
			{
				entry.value = value;
				entries_modified = true;
			}
		}
	}

	if (entries_modified)
	{
		if (Element* element = GetElement())
		{
			String new_text = BuildText();
			String text;
			if (SystemInterface* system_interface = GetSystemInterface())
				system_interface->TranslateString(text, new_text);

			rmlui_static_cast<ElementText*>(element)->SetText(text);
		}
		else
		{
			Log::Message(Log::LT_WARNING, "Could not update data view text, element no longer valid. Was it destroyed?");
		}
	}

	return entries_modified;
}